

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

string * __thiscall
Json::OurReader::getLocationLineAndColumn_abi_cxx11_(OurReader *this,Location location)

{
  Location in_RDX;
  OurReader *in_RSI;
  string *in_RDI;
  char buffer [51];
  int column;
  int line;
  allocator local_59;
  char local_58 [56];
  uint local_20;
  uint local_1c [7];
  
  getLocationLineAndColumn(in_RSI,in_RDX,(int *)local_1c,(int *)&local_20);
  snprintf(local_58,0x33,"Line %d, Column %d",(ulong)local_1c[0],(ulong)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_58,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return in_RDI;
}

Assistant:

std::string OurReader::getLocationLineAndColumn(Location location) const {
  int line, column;
  getLocationLineAndColumn(location, line, column);
  char buffer[18 + 16 + 16 + 1];
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__)
#if defined(WINCE)
  _snprintf(buffer, sizeof(buffer), "Line %d, Column %d", line, column);
#else
  sprintf_s(buffer, sizeof(buffer), "Line %d, Column %d", line, column);
#endif
#else
  snprintf(buffer, sizeof(buffer), "Line %d, Column %d", line, column);
#endif
  return buffer;
}